

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddFieldByNumber
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  bool bVar1;
  int local_34;
  Descriptor *local_30;
  undefined1 local_28 [8];
  DescriptorIntPair key;
  FieldDescriptor *field_local;
  FileDescriptorTables *this_local;
  
  key._8_8_ = field;
  local_30 = FieldDescriptor::containing_type(field);
  local_34 = FieldDescriptor::number((FieldDescriptor *)key._8_8_);
  std::pair<const_google::protobuf::Descriptor_*,_int>::
  pair<const_google::protobuf::Descriptor_*,_int,_true>
            ((pair<const_google::protobuf::Descriptor_*,_int> *)local_28,&local_30,&local_34);
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::Descriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>>>
                    (&this->fields_by_number_,(first_type *)local_28,(second_type *)&key.second);
  return bVar1;
}

Assistant:

bool FileDescriptorTables::AddFieldByNumber(const FieldDescriptor* field) {
  DescriptorIntPair key(field->containing_type(), field->number());
  return InsertIfNotPresent(&fields_by_number_, key, field);
}